

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestVerifyInt32::~TestVerifyInt32(TestVerifyInt32 *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

TestVerifyInt32::~TestVerifyInt32() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestVerifyInt32)
  SharedDtor(*this);
}